

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

int absl::lts_20240722::GenericCompare<int,std::basic_string_view<char,std::char_traits<char>>>
              (Cord *lhs,basic_string_view<char,_std::char_traits<char>_> *rhs,
              size_t size_to_compare)

{
  char *__s2;
  int iVar1;
  ulong uVar2;
  ulong __n;
  bool bVar3;
  string_view sVar4;
  
  uVar2 = (ulong)(lhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar2 & 1) == 0) {
    uVar2 = uVar2 >> 1;
  }
  else {
    uVar2 = ((lhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar2 == 0) {
    sVar4 = (string_view)ZEXT816(0);
  }
  else {
    sVar4 = Cord::InlineRep::FindFlatStartPiece(&lhs->contents_);
  }
  uVar2 = rhs->_M_len;
  __n = sVar4._M_len;
  if (uVar2 < sVar4._M_len) {
    __n = uVar2;
  }
  if (__n <= size_to_compare) {
    __s2 = rhs->_M_str;
    iVar1 = memcmp(sVar4._M_str,__s2,__n);
    bVar3 = iVar1 != 0;
    if (__n != size_to_compare && !bVar3) {
      sVar4._M_str = __s2;
      sVar4._M_len = uVar2;
      iVar1 = Cord::CompareSlowPath(lhs,sVar4,__n,size_to_compare);
      bVar3 = iVar1 != 0;
    }
    return (uint)bVar3 | iVar1 >> 0x1f;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O1/_deps/absl-src/absl/strings/cord.cc"
                ,0x3d7,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = int, RHS = std::basic_string_view<char>]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = ::memcmp(lhs_chunk.data(), rhs_chunk.data(), compared_size);
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}